

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteSwapper.h
# Opt level: O0

void __thiscall
Assimp::Intern::Getter<true,_int,_true>::operator()
          (Getter<true,_int,_true> *this,int *inout,bool le)

{
  ByteSwapper<int,_false> local_1b;
  ByteSwapper<int,_true> local_1a;
  byte local_19;
  int *piStack_18;
  bool le_local;
  int *inout_local;
  Getter<true,_int,_true> *this_local;
  
  local_19 = (le ^ 0xffU) & 1;
  piStack_18 = inout;
  inout_local = (int *)this;
  if (local_19 == 0) {
    ByteSwapper<int,_false>::operator()(&local_1b,inout);
  }
  else {
    ByteSwapper<int,_true>::operator()(&local_1a,inout);
  }
  return;
}

Assistant:

void operator() (T* inout, bool le) {
#ifdef AI_BUILD_BIG_ENDIAN
        le =  le;
#else
        le =  !le;
#endif
        if (le) {
            ByteSwapper<T,(sizeof(T)>1?true:false)> () (inout);
        }
        else ByteSwapper<T,false> () (inout);
    }